

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

int check_downrec_unroll(jit_State *J,GCproto *pt)

{
  IRIns *pIVar1;
  ushort uVar2;
  int iVar3;
  IRRef1 IVar4;
  ulong uVar5;
  
  uVar2 = J->chain[0x18];
  if (uVar2 != 0) {
    pIVar1 = (J->cur).ir;
    do {
      if (((GCproto *)(ulong)pIVar1[uVar2].field_1.op12 == pt) &&
         (IVar4 = J->chain[0xb], IVar4 != 0)) {
        iVar3 = 0;
        do {
          uVar5 = (ulong)IVar4;
          IVar4 = *(ushort *)((long)pIVar1 + uVar5 * 8 + 6);
          iVar3 = iVar3 + (uint)(pIVar1[uVar5].field_0.op1 == uVar2);
        } while (IVar4 != 0);
        if (iVar3 != 0) {
          if (J->pc != J->startpc) {
            lj_trace_err(J,LJ_TRERR_DOWNREC);
          }
          if (J->param[0xc] < iVar3 + J->tailcalled) {
            return 1;
          }
        }
      }
      uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6);
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

static int check_downrec_unroll(jit_State *J, GCproto *pt)
{
  IRRef ptref;
  for (ptref = J->chain[IR_KGC]; ptref; ptref = IR(ptref)->prev)
    if (ir_kgc(IR(ptref)) == obj2gco(pt)) {
      int count = 0;
      IRRef ref;
      for (ref = J->chain[IR_RETF]; ref; ref = IR(ref)->prev)
	if (IR(ref)->op1 == ptref)
	  count++;
      if (count) {
	if (J->pc == J->startpc) {
	  if (count + J->tailcalled > J->param[JIT_P_recunroll])
	    return 1;
	} else {
	  lj_trace_err(J, LJ_TRERR_DOWNREC);
	}
      }
    }
  return 0;
}